

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O1

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,unsigned_long_long v)

{
  char **ppcVar1;
  char *buf;
  size_t sVar2;
  
  ppcVar1 = &(this->m_buffer).m_cur;
  buf = (this->m_buffer).m_cur;
  if (0x1f < (int)ppcVar1 - (int)buf) {
    sVar2 = detail::convert<unsigned_long_long>(buf,v);
    *ppcVar1 = *ppcVar1 + sVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<< (unsigned long long v){
	formatInteger(v);

	return *this;
}